

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  char *pcVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  mbedtls_net_context mVar7;
  char *pcVar8;
  char *__nptr;
  mbedtls_net_context server_fd;
  mbedtls_net_context listen_fd;
  mbedtls_net_context client_fd;
  fd_set read_fds;
  char error_buf [100];
  
  mbedtls_net_init(&listen_fd);
  mbedtls_net_init(&client_fd);
  mbedtls_net_init(&server_fd);
  opt_0 = "localhost";
  opt_1 = "4433";
  opt_2 = "localhost";
  opt_3 = "5556";
  for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
    pcVar8 = argv[lVar6];
    pcVar3 = strchr(pcVar8,0x3d);
    if (pcVar3 == (char *)0x0) {
LAB_00102e7d:
      exit_usage(pcVar8,(char *)0x0);
      return extraout_EAX;
    }
    __nptr = pcVar3 + 1;
    *pcVar3 = '\0';
    iVar1 = strcmp(pcVar8,"server_addr");
    puVar5 = &opt_0;
    if (iVar1 == 0) {
LAB_00102a66:
      *puVar5 = __nptr;
    }
    else {
      iVar1 = strcmp(pcVar8,"server_port");
      puVar5 = &opt_1;
      if (iVar1 == 0) goto LAB_00102a66;
      iVar1 = strcmp(pcVar8,"listen_addr");
      puVar5 = &opt_2;
      if (iVar1 == 0) goto LAB_00102a66;
      iVar1 = strcmp(pcVar8,"listen_port");
      puVar5 = &opt_3;
      if (iVar1 == 0) goto LAB_00102a66;
      iVar1 = strcmp(pcVar8,"duplicate");
      if (iVar1 == 0) {
        opt_4 = atoi(__nptr);
        if (0x14 < opt_4) goto LAB_00102b15;
        goto LAB_00102a69;
      }
      iVar1 = strcmp(pcVar8,"delay");
      if (iVar1 == 0) {
        uVar2 = atoi(__nptr);
        opt_5 = uVar2;
LAB_00102abc:
        if ((0x14 < uVar2) || (uVar2 == 1)) goto LAB_00102b15;
      }
      else {
        iVar1 = strcmp(pcVar8,"delay_ccs");
        if (iVar1 == 0) {
          uVar2 = atoi(__nptr);
          opt_6 = uVar2;
          goto LAB_00102aa7;
        }
        iVar1 = strcmp(pcVar8,"drop");
        if (iVar1 == 0) {
          uVar2 = atoi(__nptr);
          opt_7 = uVar2;
          goto LAB_00102abc;
        }
        iVar1 = strcmp(pcVar8,"mtu");
        if (iVar1 == 0) {
          opt_8 = atoi(__nptr);
          if (0x4800 < opt_8) goto LAB_00102b15;
          goto LAB_00102a69;
        }
        iVar1 = strcmp(pcVar8,"bad_ad");
        if (iVar1 == 0) {
          uVar2 = atoi(__nptr);
          opt_9 = uVar2;
        }
        else {
          iVar1 = strcmp(pcVar8,"protect_hvr");
          if (iVar1 != 0) {
            iVar1 = strcmp(pcVar8,"protect_len");
            if (iVar1 == 0) {
              opt_11 = atoi(__nptr);
              if (opt_11 < 0) goto LAB_00102b15;
            }
            else {
              iVar1 = strcmp(pcVar8,"seed");
              if (iVar1 != 0) goto LAB_00102e7d;
              opt_12 = atoi(__nptr);
              if (opt_12 == 0) goto LAB_00102b15;
            }
            goto LAB_00102a69;
          }
          uVar2 = atoi(__nptr);
          opt_10 = uVar2;
        }
LAB_00102aa7:
        if (1 < uVar2) {
LAB_00102b15:
          exit_usage(pcVar8,__nptr);
          break;
        }
      }
    }
LAB_00102a69:
  }
  if (opt_12 == 0) {
    uVar4 = time((time_t *)0x0);
    opt_12 = (uint)uVar4;
    printf("  . Pseudo-random seed: %u\n",uVar4 & 0xffffffff);
  }
  srand(opt_12);
  printf("  . Connect to server on UDP/%s/%s ...",opt_0,opt_1);
  fflush(_stdout);
  uVar2 = mbedtls_net_connect(&server_fd,opt_0,opt_1,1);
  if (uVar2 == 0) {
    puts(" ok");
    printf("  . Bind on UDP/%s/%s ...",opt_2,opt_3);
    fflush(_stdout);
    uVar2 = mbedtls_net_bind(&listen_fd,opt_2,opt_3,1);
    if (uVar2 == 0) {
      puts(" ok");
LAB_00102c91:
      mbedtls_net_free(&client_fd);
      printf("  . Waiting for a remote connection ...");
      fflush(_stdout);
      uVar2 = mbedtls_net_accept(&listen_fd,&client_fd,(void *)0x0,0,(size_t *)0x0);
      if (uVar2 == 0) {
        puts(" ok");
        memset(&prev,0,0x4820);
        memset(dropped,0,0x800);
        mVar7 = server_fd;
        if (server_fd.fd < client_fd.fd) {
          mVar7 = client_fd;
        }
        if (mVar7.fd <= listen_fd.fd) {
          mVar7 = listen_fd;
        }
        lVar6 = 0;
        do {
          do {
            for (; lVar6 != 0x10; lVar6 = lVar6 + 1) {
              read_fds.__fds_bits[lVar6] = 0;
            }
            read_fds.__fds_bits[server_fd.fd / 0x40] =
                 read_fds.__fds_bits[server_fd.fd / 0x40] | 1L << ((byte)server_fd.fd & 0x3f);
            read_fds.__fds_bits[client_fd.fd / 0x40] =
                 read_fds.__fds_bits[client_fd.fd / 0x40] | 1L << ((byte)client_fd.fd & 0x3f);
            read_fds.__fds_bits[listen_fd.fd / 0x40] =
                 read_fds.__fds_bits[listen_fd.fd / 0x40] | 1L << ((byte)listen_fd.fd & 0x3f);
            uVar2 = select(mVar7.fd + 1,(fd_set *)&read_fds,(fd_set *)0x0,(fd_set *)0x0,
                           (timeval *)0x0);
            if ((int)uVar2 < 1) {
              perror("select");
              if (uVar2 != 0) goto LAB_00102c0d;
              iVar1 = 0;
              goto LAB_00102c42;
            }
            if ((((ulong)read_fds.__fds_bits[listen_fd.fd / 0x40] >>
                  ((long)listen_fd.fd % 0x40 & 0x3fU) & 1) != 0) ||
               ((((ulong)read_fds.__fds_bits[client_fd.fd / 0x40] >>
                  ((long)client_fd.fd % 0x40 & 0x3fU) & 1) != 0 &&
                (iVar1 = handle_message("S <- C",&server_fd,&client_fd), iVar1 != 0))))
            goto LAB_00102c91;
            lVar6 = 0;
          } while (((ulong)read_fds.__fds_bits[server_fd.fd / 0x40] >>
                    ((long)server_fd.fd % 0x40 & 0x3fU) & 1) == 0);
          iVar1 = handle_message("S -> C",&client_fd,&server_fd);
          lVar6 = 0;
        } while (iVar1 == 0);
        goto LAB_00102c91;
      }
      printf(" failed\n  ! mbedtls_net_accept returned %d\n\n",(ulong)uVar2);
      goto LAB_00102c0d;
    }
    pcVar8 = " failed\n  ! mbedtls_net_bind returned %d\n\n";
  }
  else {
    pcVar8 = " failed\n  ! mbedtls_net_connect returned %d\n\n";
  }
  printf(pcVar8,(ulong)uVar2);
LAB_00102c0d:
  iVar1 = 1;
  mbedtls_strerror(uVar2,error_buf,100);
  printf("Last error was: -0x%04X - %s\n\n",(ulong)-uVar2,error_buf);
  fflush(_stdout);
LAB_00102c42:
  mbedtls_net_free(&client_fd);
  mbedtls_net_free(&server_fd);
  mbedtls_net_free(&listen_fd);
  return iVar1;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret;

    mbedtls_net_context listen_fd, client_fd, server_fd;

    int nb_fds;
    fd_set read_fds;

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_net_init( &server_fd );

    get_options( argc, argv );

    /*
     * Decisions to drop/delay/duplicate packets are pseudo-random: dropping
     * exactly 1 in N packets would lead to problems when a flight has exactly
     * N packets: the same packet would be dropped on every resend.
     *
     * In order to be able to reproduce problems reliably, the seed may be
     * specified explicitly.
     */
    if( opt.seed == 0 )
    {
        opt.seed = (unsigned int) time( NULL );
        mbedtls_printf( "  . Pseudo-random seed: %u\n", opt.seed );
    }

    srand( opt.seed );

    /*
     * 0. "Connect" to the server
     */
    mbedtls_printf( "  . Connect to server on UDP/%s/%s ...",
            opt.server_addr, opt.server_port );
    fflush( stdout );

    if( ( ret = mbedtls_net_connect( &server_fd, opt.server_addr, opt.server_port,
                             MBEDTLS_NET_PROTO_UDP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1. Setup the "listening" UDP socket
     */
    mbedtls_printf( "  . Bind on UDP/%s/%s ...",
            opt.listen_addr, opt.listen_port );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, opt.listen_addr, opt.listen_port,
                          MBEDTLS_NET_PROTO_UDP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Wait until a client connects
     */
accept:
    mbedtls_net_free( &client_fd );

    mbedtls_printf( "  . Waiting for a remote connection ..." );
    fflush( stdout );

    if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                    NULL, 0, NULL ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_accept returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 3. Forward packets forever (kill the process to terminate it)
     */
    clear_pending();
    memset( dropped, 0, sizeof( dropped ) );

    nb_fds = client_fd.fd;
    if( nb_fds < server_fd.fd )
        nb_fds = server_fd.fd;
    if( nb_fds < listen_fd.fd )
        nb_fds = listen_fd.fd;
    ++nb_fds;

    while( 1 )
    {
        FD_ZERO( &read_fds );
        FD_SET( server_fd.fd, &read_fds );
        FD_SET( client_fd.fd, &read_fds );
        FD_SET( listen_fd.fd, &read_fds );

        if( ( ret = select( nb_fds, &read_fds, NULL, NULL, NULL ) ) <= 0 )
        {
            perror( "select" );
            goto exit;
        }

        if( FD_ISSET( listen_fd.fd, &read_fds ) )
            goto accept;

        if( FD_ISSET( client_fd.fd, &read_fds ) )
        {
            if( ( ret = handle_message( "S <- C",
                                        &server_fd, &client_fd ) ) != 0 )
                goto accept;
        }

        if( FD_ISSET( server_fd.fd, &read_fds ) )
        {
            if( ( ret = handle_message( "S -> C",
                                        &client_fd, &server_fd ) ) != 0 )
                goto accept;
        }
    }

exit:

#ifdef MBEDTLS_ERROR_C
    if( ret != 0 )
    {
        char error_buf[100];
        mbedtls_strerror( ret, error_buf, 100 );
        mbedtls_printf( "Last error was: -0x%04X - %s\n\n", - ret, error_buf );
        fflush( stdout );
    }
#endif

    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &server_fd );
    mbedtls_net_free( &listen_fd );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret != 0 );
}